

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitreader.h
# Opt level: O2

unsigned_long __thiscall LLVMBC::BitReader::vbr<unsigned_long>(BitReader *this,size_t groupBitSize)

{
  unsigned_long uVar1;
  char *__assertion;
  ulong uVar2;
  uint uVar3;
  byte scratch [8];
  
  if (groupBitSize < 2) {
    __assertion = "groupBitSize > 1 && \"chunk size must be greater than 1\"";
    uVar3 = 0x61;
  }
  else if (groupBitSize < 9) {
    scratch[0] = '\0';
    scratch[1] = '\0';
    scratch[2] = '\0';
    scratch[3] = '\0';
    scratch[4] = '\0';
    scratch[5] = '\0';
    scratch[6] = '\0';
    scratch[7] = '\0';
    uVar3 = 1 << ((byte)(groupBitSize - 1) & 0x1f);
    uVar2 = 0;
    uVar1 = 0;
    while( true ) {
      ReadBits(this,groupBitSize,scratch);
      if (0x3f < uVar2) break;
      uVar1 = uVar1 + ((ulong)(uVar3 + 0xff & (uint)scratch[0]) << ((byte)uVar2 & 0x3f));
      uVar2 = uVar2 + (groupBitSize - 1);
      if ((uVar3 & scratch[0]) == 0) {
        return uVar1;
      }
    }
    __assertion = "shift <= 63";
    uVar3 = 0x6f;
  }
  else {
    __assertion = "groupBitSize <= 8 && \"Only chunk sizes up to 8 supported\"";
    uVar3 = 0x62;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                ,uVar3,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
}

Assistant:

T vbr(const size_t groupBitSize)
  {
    uint64_t ret = 0;

    assert(groupBitSize > 1 && "chunk size must be greater than 1");
    assert(groupBitSize <= 8 && "Only chunk sizes up to 8 supported");

    // Avoid false positive warning.
    byte scratch[8] = {};

    const byte hibit = 1 << (groupBitSize - 1);
    const byte lobits = hibit - 1;

    uint64_t shift = 0;
    do
    {
      ReadBits(groupBitSize, scratch);

      assert(shift <= 63);

      ret += (uint64_t(scratch[0] & lobits) << shift);

      shift += uint64_t(groupBitSize - 1);
    } while(scratch[0] & hibit);

#ifndef NDEBUG
    // check for overflow of the return type
    const uint64_t mask = ((1ULL << (sizeof(T) * 8 - 1)) - 1) << 1 | 1;
    assert((ret & mask) == ret);
#endif

    return T(ret);
  }